

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  Mat *in_RDI;
  int i;
  float bias;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float *in_stack_ffffffffffffff60;
  int local_8c;
  Mat local_78;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    Mat::channel(in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    in_stack_ffffffffffffff60 = Mat::operator_cast_to_float_(&local_78);
    Mat::~Mat((Mat *)0x13f215);
    local_38 = in_stack_ffffffffffffff60;
    pfVar2 = Mat::operator[]((Mat *)&in_RDI[2].refcount,local_2c);
    fVar1 = *pfVar2;
    for (local_8c = 0; local_8c < local_28; local_8c = local_8c + 1) {
      local_38[local_8c] = fVar1 + local_38[local_8c];
    }
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i=0; i<size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}